

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O3

LogStream * __thiscall tt::LogStream::operator<<(LogStream *this,longdouble v)

{
  char **ppcVar1;
  char *__s;
  int iVar2;
  
  ppcVar1 = &(this->m_buffer).m_cur;
  __s = (this->m_buffer).m_cur;
  if (0x1f < (int)ppcVar1 - (int)__s) {
    iVar2 = snprintf(__s,0x20,"%.12Lg");
    *ppcVar1 = *ppcVar1 + iVar2;
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<< (long double v){
	if(m_buffer.avail() >= kMaxNumbericSize){
		int len = snprintf(m_buffer.current(),kMaxNumbericSize,"%.12Lg",v);

		m_buffer.add(len);
	}


	return *this;
}